

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O2

rectangle *
dlib::centered_rect(rectangle *__return_storage_ptr__,long x,long y,unsigned_long width,
                   unsigned_long height)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)width / -2 + x;
  __return_storage_ptr__->l = lVar2;
  lVar1 = (long)height / -2 + y;
  __return_storage_ptr__->t = lVar1;
  __return_storage_ptr__->r = width + lVar2 + -1;
  __return_storage_ptr__->b = lVar1 + height + -1;
  return __return_storage_ptr__;
}

Assistant:

inline const rectangle centered_rect (
        long x,
        long y,
        unsigned long width,
        unsigned long height
    )
    {
        rectangle result;
        result.set_left ( x - static_cast<long>(width) / 2 );
        result.set_top ( y - static_cast<long>(height) / 2 );
        result.set_right ( result.left() + width - 1 );
        result.set_bottom ( result.top() + height - 1 );
        return result;
    }